

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.cpp
# Opt level: O0

string_char lsvm::string::next(iterator *it)

{
  byte *pbVar1;
  uint8_t *s;
  string_char sc;
  iterator *it_local;
  string_char local_4;
  
  sc = 0;
  if (it->p < (int)it->s->size) {
    it->p = it->p + 1;
  }
  if (it->s->size == it->p) {
    local_4 = 0;
  }
  else {
    pbVar1 = (byte *)((long)&it->s[1].count + (long)it->p);
    if (*pbVar1 < 0x80) {
      sc = *pbVar1 & 0x7f;
    }
    else if (*pbVar1 < 0xe0) {
      sc = pbVar1[1] & 0x3f | (*pbVar1 & 0x1f) << 6;
      it->p = it->p + 1;
    }
    else if (*pbVar1 < 0xf0) {
      sc = pbVar1[2] & 0x3f | (pbVar1[1] & 0x3f | (*pbVar1 & 0xf) << 6) << 6;
      it->p = it->p + 2;
    }
    else if (*pbVar1 < 0xf5) {
      sc = pbVar1[3] & 0x3f | (pbVar1[2] & 0x3f | (pbVar1[1] & 0x3f | (*pbVar1 & 7) << 6) << 6) << 6
      ;
      it->p = it->p + 3;
    }
    local_4 = sc;
  }
  return local_4;
}

Assistant:

string_char next(iterator* it){
    string_char sc = 0;    
    if((int32_t)it->s->size > it->p)
        it->p += 1;
    if((int32_t)it->s->size == it->p)
        return null;

    uint8_t* s = reinterpret_cast<uint8_t*>(it->s+1);
    s += it->p;
    
    if (*s < 0x80) {
        sc = (*s & 0x7F);
    } else if (*s < 0xE0) {
        sc = (*s & 0x1F);
        sc <<= 6;
        sc |= (*(s+1) & 0x3F);
        it->p += 1;
    } else if (*s < 0xF0) {
        sc = (*s & 0xF);
        sc <<= 6;
        sc |= (*(s+1) & 0x3F);
        sc <<= 6;
        sc |= (*(s+2) & 0x3F);
        it->p += 2;
    } else if (*s < 0xF5) {
        sc = (*s & 0x7);
        sc <<= 6;
        sc |= (*(s+1) & 0x3F);
        sc <<= 6;
        sc |= (*(s+2) & 0x3F);
        sc <<= 6;
        sc |= (*(s+3) & 0x3F);
        it->p += 3;
    }

    return sc;
}